

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O0

void __thiscall OpenMD::Electrostatic::~Electrostatic(Electrostatic *this)

{
  undefined8 *in_RDI;
  vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
  *unaff_retaddr;
  FluctuatingChargeForces *this_00;
  
  *in_RDI = &PTR__Electrostatic_00512c18;
  this_00 = (FluctuatingChargeForces *)in_RDI[0x21];
  if (this_00 != (FluctuatingChargeForces *)0x0) {
    FluctuatingChargeForces::~FluctuatingChargeForces(this_00);
    operator_delete(this_00,0x100);
  }
  std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x40e6ab);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x40e6bb);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x40e6cb);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x40e6db);
  ElectrostaticAtomData::~ElectrostaticAtomData((ElectrostaticAtomData *)0x40e6eb);
  ElectrostaticAtomData::~ElectrostaticAtomData((ElectrostaticAtomData *)0x40e6fb);
  std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x40e70b);
  std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x40e71b);
  std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x40e72b);
  std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x40e73b);
  std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x40e74b);
  std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x40e75b);
  std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x40e76b);
  std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x40e77b);
  std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x40e78b);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::ElectrostaticScreeningMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::ElectrostaticScreeningMethod>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::ElectrostaticScreeningMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::ElectrostaticScreeningMethod>_>_>
          *)0x40e79b);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::ElectrostaticSummationMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::ElectrostaticSummationMethod>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::ElectrostaticSummationMethod,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::ElectrostaticSummationMethod>_>_>
          *)0x40e7ab);
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::~set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x40e7bb);
  std::
  vector<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
  ::~vector((vector<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>,_std::allocator<std::vector<std::shared_ptr<OpenMD::CubicSpline>,_std::allocator<std::shared_ptr<OpenMD::CubicSpline>_>_>_>_>
             *)unaff_retaddr);
  std::vector<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>::
  ~vector(unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x40e7fb);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x40e815);
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  ElectrostaticInteraction::~ElectrostaticInteraction((ElectrostaticInteraction *)0x40e82b);
  return;
}

Assistant:

Electrostatic::~Electrostatic() { delete flucQ_; }